

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpConnection.cpp
# Opt level: O1

ssize_t __thiscall
sznet::net::TcpConnection::send(TcpConnection *this,int __fd,void *__buf,size_t __n,int __flags)

{
  EventLoop *this_00;
  size_type sVar1;
  bool bVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *in_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  undefined4 in_register_00000034;
  Buffer *this_01;
  _Any_data local_a8;
  code *pcStack_98;
  code *pcStack_90;
  code *local_88;
  undefined8 local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_78;
  size_type local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  TcpConnection *local_58;
  string local_50;
  
  this_01 = (Buffer *)CONCAT44(in_register_00000034,__fd);
  if (this->m_state == kConnected) {
    bVar2 = EventLoop::isInLoopThread(this->m_loop);
    if (bVar2) {
      sendInLoop(this,(this_01->m_buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start + this_01->m_readerIndex,
                 this_01->m_writerIndex - this_01->m_readerIndex);
      in_RAX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)this_01->m_nCheapPrepend;
      this_01->m_readerIndex = (size_t)in_RAX;
      this_01->m_writerIndex = (size_t)in_RAX;
    }
    else {
      this_00 = this->m_loop;
      Buffer::retrieveAsString_abi_cxx11_
                (&local_50,this_01,this_01->m_writerIndex - this_01->m_readerIndex);
      sVar1 = local_50._M_string_length;
      local_88 = sendInLoop;
      local_80 = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p == &local_50.field_2) {
        local_68._8_8_ = local_50.field_2._8_8_;
        local_78 = &local_68;
      }
      else {
        local_78 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)local_50._M_dataplus._M_p;
      }
      local_68._M_allocated_capacity._1_7_ = local_50.field_2._M_allocated_capacity._1_7_;
      local_68._M_local_buf[0] = local_50.field_2._M_local_buf[0];
      local_70 = local_50._M_string_length;
      local_50._M_string_length = 0;
      local_50.field_2._M_local_buf[0] = '\0';
      local_a8._M_unused._M_object = (void *)0x0;
      local_a8._8_8_ = 0;
      pcStack_98 = (code *)0x0;
      pcStack_90 = (code *)0x0;
      local_58 = this;
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_a8._M_unused._M_object = operator_new(0x38);
      *(code **)local_a8._M_unused._0_8_ = sendInLoop;
      *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
      *(code **)((long)local_a8._M_unused._0_8_ + 0x10) =
           (code *)((long)local_a8._M_unused._0_8_ + 0x20);
      if (local_78 == &local_68) {
        *(size_type *)((long)local_a8._M_unused._0_8_ + 0x20) = local_68._M_allocated_capacity;
        *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x28) = local_68._8_8_;
      }
      else {
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)((long)local_a8._M_unused._0_8_ + 0x10) = local_78;
        *(size_type *)((long)local_a8._M_unused._0_8_ + 0x20) = local_68._M_allocated_capacity;
      }
      *(size_type *)((long)local_a8._M_unused._0_8_ + 0x18) = sVar1;
      local_70 = 0;
      local_68._M_allocated_capacity = local_68._M_allocated_capacity & 0xffffffffffffff00;
      *(TcpConnection **)((long)local_a8._M_unused._0_8_ + 0x30) = local_58;
      pcStack_90 = std::
                   _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>_>
                   ::_M_invoke;
      pcStack_98 = std::
                   _Function_handler<void_(),_std::_Bind<void_(sznet::net::TcpConnection::*(sznet::net::TcpConnection_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>))(const_sznet::StringPiece_&)>_>
                   ::_M_manager;
      local_78 = &local_68;
      EventLoop::runInLoop(this_00,(Functor *)&local_a8);
      if (pcStack_98 != (code *)0x0) {
        (*pcStack_98)(&local_a8,&local_a8,__destroy_functor);
      }
      if (local_78 != &local_68) {
        operator_delete(local_78);
      }
      in_RAX = &local_50.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != in_RAX) {
        operator_delete(local_50._M_dataplus._M_p);
        in_RAX = extraout_RAX;
      }
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void TcpConnection::send(Buffer* buf)
{
	if (m_state == kConnected)
	{
		if (m_loop->isInLoopThread())
		{
			sendInLoop(buf->peek(), buf->readableBytes());
			buf->retrieveAll();
		}
		else
		{
			void (TcpConnection::*fp)(const StringPiece& message) = &TcpConnection::sendInLoop;
			// FIXME std::forward<string>(message)
			m_loop->runInLoop(std::bind(fp, this, buf->retrieveAllAsString()));
		}
	}
}